

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

string * __thiscall
foxxll::config::default_disk_path_abi_cxx11_(string *__return_storage_ptr__,config *this)

{
  allocator local_19;
  config *local_18;
  config *this_local;
  
  local_18 = this;
  this_local = (config *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"/var/tmp/foxxll",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string config::default_disk_path()
{
#if !FOXXLL_WINDOWS
    return "/var/tmp/foxxll";
#else
    char* tmpstr = new char[255];
    if (GetTempPathA(255, tmpstr) == 0)
        FOXXLL_THROW_WIN_LASTERROR(resource_error, "GetTempPathA()");
    std::string result = tmpstr;
    result += "foxxll.tmp";
    delete[] tmpstr;
    return result;
#endif
}